

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

void __thiscall
kj::Vector<capnp::schema::Node::SourceInfo::Reader>::
addAll<capnp::schema::Node::SourceInfo::Reader*>
          (Vector<capnp::schema::Node::SourceInfo::Reader> *this,Reader *begin,Reader *end)

{
  size_t sVar1;
  ulong minCapacity;
  size_t needed;
  Reader *end_local;
  Reader *begin_local;
  Vector<capnp::schema::Node::SourceInfo::Reader> *this_local;
  
  sVar1 = ArrayBuilder<capnp::schema::Node::SourceInfo::Reader>::size(&this->builder);
  minCapacity = sVar1 + ((long)end - (long)begin) / 0x30;
  sVar1 = ArrayBuilder<capnp::schema::Node::SourceInfo::Reader>::capacity(&this->builder);
  if (sVar1 < minCapacity) {
    grow(this,minCapacity);
  }
  ArrayBuilder<capnp::schema::Node::SourceInfo::Reader>::
  addAll<capnp::schema::Node::SourceInfo::Reader*,false>(&this->builder,begin,end);
  return;
}

Assistant:

inline void addAll(Iterator begin, Iterator end) {
    size_t needed = builder.size() + (end - begin);
    if (needed > builder.capacity()) grow(needed);
    builder.addAll(begin, end);
  }